

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzarc3d.h
# Opt level: O2

void __thiscall
pzgeom::TPZArc3D::TPZArc3D
          (TPZArc3D *this,TPZArc3D *cp,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcNdMap)

{
  REAL RVar1;
  
  TPZNodeRep<3,_pztopology::TPZLine>::TPZNodeRep
            (&this->super_TPZNodeRep<3,_pztopology::TPZLine>,&PTR_PTR_016e1d00,
             &cp->super_TPZNodeRep<3,_pztopology::TPZLine>,gl2lcNdMap);
  (this->super_TPZNodeRep<3,_pztopology::TPZLine>).super_TPZLine.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZArc3D_016e1ca8;
  TPZFNMatrix<9,_double>::TPZFNMatrix(&this->fICnBase);
  TPZFNMatrix<9,_double>::TPZFNMatrix(&this->fIBaseCn);
  TPZManVector<double,_3>::TPZManVector(&this->fCenter3D,0);
  TPZManVector<double,_3>::TPZManVector(&this->finitialVector,0);
  TPZFMatrix<double>::operator=
            (&(this->fICnBase).super_TPZFMatrix<double>,&(cp->fICnBase).super_TPZFMatrix<double>);
  TPZFMatrix<double>::operator=
            (&(this->fIBaseCn).super_TPZFMatrix<double>,&(cp->fIBaseCn).super_TPZFMatrix<double>);
  TPZManVector<double,_3>::operator=(&this->fCenter3D,&cp->fCenter3D);
  TPZManVector<double,_3>::operator=(&this->finitialVector,&cp->finitialVector);
  RVar1 = cp->fRadius;
  this->fAngle = cp->fAngle;
  this->fRadius = RVar1;
  RVar1 = cp->fYcenter;
  this->fXcenter = cp->fXcenter;
  this->fYcenter = RVar1;
  return;
}

Assistant:

TPZArc3D(const TPZArc3D &cp,std::map<int64_t,int64_t> & gl2lcNdMap) : 
            TPZRegisterClassId(&TPZArc3D::ClassId),
            pzgeom::TPZNodeRep<NNodes,pztopology::TPZLine>(cp,gl2lcNdMap){
			this->fICnBase = cp.fICnBase;
			this->fIBaseCn = cp.fIBaseCn;
			this->fCenter3D = cp.fCenter3D;
                this->finitialVector = cp.finitialVector;
                
			this->fRadius = cp.fRadius;
                this->fAngle = cp.fAngle;
                this->fXcenter = cp.fXcenter;
                this->fYcenter = cp.fYcenter;
		}